

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDRefactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Dar_RefPar_t Pars;
  Dar_RefPar_t local_60;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  Dar_ManDefaultRefParams(&local_60);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"MKCelzvwh"), iVar6 = globalUtilOptind, 0x6b < iVar1)
    {
      if (iVar1 < 0x77) {
        piVar3 = &local_60.fUpdateLevel;
        if ((iVar1 != 0x6c) && (piVar3 = &local_60.fVerbose, iVar1 != 0x76)) goto LAB_0025e615;
      }
      else if (iVar1 == 0x77) {
        piVar3 = &local_60.fVeryVerbose;
      }
      else {
        piVar3 = &local_60.fUseZeros;
        if (iVar1 != 0x7a) goto LAB_0025e615;
      }
LAB_0025e5b9:
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (iVar1 < 0x4d) {
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
LAB_0025e5c1:
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0025e609:
          Abc_Print(-1,pcVar4);
          break;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nCutsMax = uVar2;
      }
      else {
        if (iVar1 != 0x4b) {
          if (iVar1 == -1) {
            if (local_38 == (Abc_Ntk_t *)0x0) {
              pcVar4 = "Empty network.\n";
            }
            else if (local_38->ntkType == ABC_NTK_STRASH) {
              if (0xfffffff3 < local_60.nLeafMax - 0x10U) {
                pNtk = Abc_NtkDRefactor(local_38,&local_60);
                if (pNtk != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(local_40,pNtk);
                  return 0;
                }
                Abc_Print(-1,"Command has failed.\n");
                return 0;
              }
              pcVar4 = "This command only works for cut sizes 4 <= K <= 15.\n";
            }
            else {
              pcVar4 = "This command works only for strashed networks.\n";
            }
            iVar6 = -1;
            goto LAB_0025e735;
          }
          break;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
          goto LAB_0025e609;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nLeafMax = uVar2;
      }
    }
    else {
      if (iVar1 != 0x4d) {
        piVar3 = &local_60.fExtend;
        if (iVar1 == 0x65) goto LAB_0025e5b9;
        break;
      }
      if (argc <= globalUtilOptind) goto LAB_0025e5c1;
      uVar2 = atoi(argv[globalUtilOptind]);
      local_60.nMffcMin = uVar2;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
LAB_0025e615:
  Abc_Print(-2,"usage: drf [-M num] [-K num] [-C num] [-elzvwh]\n");
  Abc_Print(-2,"\t         performs combinational AIG refactoring\n");
  Abc_Print(-2,"\t-M num : the min MFFC size to attempt refactoring [default = %d]\n",
            (ulong)(uint)local_60.nMffcMin);
  Abc_Print(-2,"\t-K num : the max number of cuts leaves [default = %d]\n",
            (ulong)(uint)local_60.nLeafMax);
  Abc_Print(-2,"\t-C num : the max number of cuts to try at a node [default = %d]\n",
            (ulong)(uint)local_60.nCutsMax);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_60.fExtend == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-e     : toggle extending tbe cut below MFFC [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_60.fUpdateLevel == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-l     : toggle preserving the number of levels [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_60.fUseZeros == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-z     : toggle using zero-cost replacements [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_60.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
  if (local_60.fVeryVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle very verbose printout [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_0025e735:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandDRefactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Dar_RefPar_t Pars, * pPars = &Pars;
    int c;

    extern Abc_Ntk_t * Abc_NtkDRefactor( Abc_Ntk_t * pNtk, Dar_RefPar_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Dar_ManDefaultRefParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MKCelzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMffcMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMffcMin < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLeafMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLeafMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'e':
            pPars->fExtend ^= 1;
            break;
        case 'l':
            pPars->fUpdateLevel ^= 1;
            break;
        case 'z':
            pPars->fUseZeros ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    if ( pPars->nLeafMax < 4 || pPars->nLeafMax > 15 )
    {
        Abc_Print( -1, "This command only works for cut sizes 4 <= K <= 15.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDRefactor( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: drf [-M num] [-K num] [-C num] [-elzvwh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG refactoring\n" );
    Abc_Print( -2, "\t-M num : the min MFFC size to attempt refactoring [default = %d]\n", pPars->nMffcMin );
    Abc_Print( -2, "\t-K num : the max number of cuts leaves [default = %d]\n", pPars->nLeafMax );
    Abc_Print( -2, "\t-C num : the max number of cuts to try at a node [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-e     : toggle extending tbe cut below MFFC [default = %s]\n", pPars->fExtend? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", pPars->fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle using zero-cost replacements [default = %s]\n", pPars->fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle very verbose printout [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}